

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O1

void __thiscall Reader::splittokens(Reader *this)

{
  _Rb_tree_header *p_Var1;
  ProcessedToken *pPVar2;
  LpSectionKeyword LVar3;
  _Base_ptr p_Var4;
  key_type kVar5;
  bool bVar6;
  mapped_type *pmVar7;
  invalid_argument *this_00;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  ProcessedToken *pPVar10;
  LpSectionKeyword currentsection;
  key_type local_3c;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *local_38;
  
  local_3c = NONE;
  pPVar10 = (this->processedtokens).
            super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pPVar10 !=
      (this->processedtokens).super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_38 = &this->sectiontokens;
    p_Var1 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
    bVar6 = false;
    do {
      kVar5 = local_3c;
      if (pPVar10->type == SECID) {
        LVar3 = (pPVar10->field_1).keyword;
        if ((local_3c != NONE) && (local_3c != LVar3)) {
          if (!bVar6) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_00,"File not existent or illegal file format.");
            goto LAB_001df0e3;
          }
          pmVar7 = std::
                   map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   ::operator[](local_38,&local_3c);
          (pmVar7->second)._M_current = pPVar10;
          local_3c = NONE;
          bVar6 = false;
        }
        pPVar2 = pPVar10 + 1;
        if ((pPVar2 == (this->processedtokens).
                       super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
                       super__Vector_impl_data._M_finish) || (pPVar2->type == SECID)) {
          if ((local_3c != NONE) && (local_3c != pPVar10[1].field_1.keyword)) {
            if (bVar6 == false) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (this_00,"File not existent or illegal file format.");
              goto LAB_001df0e3;
            }
            pmVar7 = std::
                     map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                     ::operator[](local_38,&local_3c);
            (pmVar7->second)._M_current = pPVar10;
            bVar6 = false;
          }
          local_3c = NONE;
          if (bVar6 != false) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_00,"File not existent or illegal file format.");
            goto LAB_001df0e3;
          }
        }
        else {
          if (kVar5 != LVar3) {
            local_3c = (pPVar10->field_1).keyword;
            p_Var4 = (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var8 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < (int)local_3c]) {
              if ((int)local_3c <= (int)*(size_t *)(p_Var4 + 1)) {
                p_Var8 = p_Var4;
              }
            }
            p_Var9 = p_Var1;
            if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
               (p_Var9 = (_Rb_tree_header *)p_Var8,
               (int)local_3c < (int)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
              p_Var9 = p_Var1;
            }
            if (p_Var9 != p_Var1) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (this_00,"File not existent or illegal file format.");
              goto LAB_001df0e3;
            }
            if (bVar6 != false) {
              this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (this_00,"File not existent or illegal file format.");
              goto LAB_001df0e3;
            }
            pmVar7 = std::
                     map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                     ::operator[](local_38,&local_3c);
            (pmVar7->first)._M_current = pPVar2;
            bVar6 = true;
          }
          if ((local_3c == NONE) == bVar6) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_00,"File not existent or illegal file format.");
            goto LAB_001df0e3;
          }
        }
      }
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 !=
             (this->processedtokens).
             super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_3c == NONE) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"File not existent or illegal file format.");
LAB_001df0e3:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void Reader::splittokens() {
  LpSectionKeyword currentsection = LpSectionKeyword::NONE;

  bool debug_open_section = false;
  for (std::vector<ProcessedToken>::iterator it(processedtokens.begin());
       it != processedtokens.end(); ++it) {
    // Look for section keywords
    if (it->type != ProcessedTokenType::SECID) continue;
    // currentsection is initially LpSectionKeyword::NONE, so the
    // first section ID will be a new section type
    //
    // Only record change of section and check for repeated
    // section if the keyword is for a different section. Allows
    // repetition of Integers and General (cf #1299) for example
    const bool new_section_type = currentsection != it->keyword;
    if (new_section_type) {
      if (currentsection != LpSectionKeyword::NONE) {
        // Current section is non-trivial, so mark its end, using the
        // value of currentsection to indicate that there is no open
        // section
        lpassert(debug_open_section);
        sectiontokens[currentsection].second = it;
        debug_open_section = false;
        currentsection = LpSectionKeyword::NONE;
      }
    }
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    if (next == processedtokens.end() ||
        next->type == ProcessedTokenType::SECID) {
      // Reached the end of the tokens or the new section is empty
      //
      // currentsection will be LpSectionKeyword::NONE unless the
      // second of two sections of the same type is empty and the
      // next section is of a new type, in which case mark the end of
      // the current section
      if (currentsection != LpSectionKeyword::NONE &&
          currentsection != next->keyword) {
        lpassert(debug_open_section);
        sectiontokens[currentsection].second = it;
        debug_open_section = false;
      }
      currentsection = LpSectionKeyword::NONE;
      lpassert(!debug_open_section);
      continue;
    }
    // Next section is non-empty
    if (new_section_type) {
      // Section type change
      currentsection = it->keyword;
      // Make sure the new section type has not occurred previously
      lpassert(sectiontokens.count(currentsection) == 0);
      // Remember the beginning of the new section: its the token
      // following the current one
      lpassert(!debug_open_section);
      sectiontokens[currentsection].first = next;
      debug_open_section = true;
    }
    // Always ends with either an open section or a section type of
    // LpSectionKeyword::NONE
    lpassert(debug_open_section != (currentsection == LpSectionKeyword::NONE));
  }
  // Check that the last section has been closed
  lpassert(currentsection == LpSectionKeyword::NONE);
}